

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O1

void __thiscall EVPExtraTest_TLSEncodedPoint_Test::TestBody(EVPExtraTest_TLSEncodedPoint_Test *this)

{
  uint8_t *in;
  void *pvVar1;
  int iVar2;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer pcVar5;
  char *in_R9;
  bool bVar6;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  ScopedTrace gtest_trace_1200;
  ScopedTrace gtest_trace_1199;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> from_spki;
  UniquePtr<EVP_PKEY> from_encoded_point;
  ScopedCBB cbb;
  size_t len;
  uint8_t *data;
  anon_struct_56_3_7c433676 kTests [2];
  CBS spki;
  ScopedTrace local_1da;
  ScopedTrace local_1d9;
  Bytes local_1d8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [3];
  _Head_base<0UL,_evp_pkey_st_*,_false> local_160;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_158;
  undefined1 local_150 [16];
  anon_union_32_2_4f6aaa2e_for_u local_140;
  long alStack_108 [3];
  AssertHelper local_f0;
  size_t local_e8;
  long *local_e0;
  int local_d8 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  undefined4 local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  CBS local_68;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  local_d8[0] = 0x198;
  memcpy(local_150,&DAT_005570a0,0x5b);
  __l._M_len = 0x5b;
  __l._M_array = local_150;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_d0,__l,(allocator_type *)&local_1d8);
  memcpy(local_1a8,&DAT_005570fb,0x41);
  __l_00._M_len = 0x41;
  __l_00._M_array = local_1a8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_b8,__l_00,(allocator_type *)&local_160);
  local_a0 = 0x3b4;
  uStack_48 = 0x3b35b326;
  uStack_44 = 0x4c1cabd0a603a910;
  uStack_58 = 0xa4c19435db303058;
  uStack_50 = 0x7c5fb124;
  local_4c = 0xec246672;
  local_68.data = (uint8_t *)0x652b030605302a30;
  local_68.len = 0x6768dbe60021036e;
  __l_01._M_len = 0x2c;
  __l_01._M_array = (iterator)&local_68;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_98,__l_01,(allocator_type *)&local_e0);
  local_1b8 = 0x3b35b326ec246672;
  uStack_1b0 = 0x4c1cabd0a603a910;
  local_1c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xdb3030586768dbe6
  ;
  pbStack_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0x7c5fb124a4c19435;
  __l_02._M_len = 0x20;
  __l_02._M_array = (iterator)&local_1c8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_80,__l_02,(allocator_type *)&local_e8);
  lVar4 = 0;
  while( true ) {
    testing::ScopedTrace::ScopedTrace<int>
              (&local_1d9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x4af,(int *)((long)local_d8 + lVar4));
    local_150._0_8_ =
         *(long *)((long)&local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar4);
    local_150._8_8_ =
         *(long *)((long)&local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + lVar4) - local_150._0_8_;
    testing::ScopedTrace::ScopedTrace<Bytes>
              (&local_1da,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x4b0,(Bytes *)local_150);
    local_68.data =
         *(uint8_t **)
          ((long)&local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start + lVar4);
    local_68.len = *(long *)((long)&local_d0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar4) -
                   (long)local_68.data;
    local_160._M_head_impl = EVP_parse_public_key(&local_68);
    local_1a8[0] = (internal)((EVP_PKEY *)local_160._M_head_impl != (EVP_PKEY *)0x0);
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((EVP_PKEY *)local_160._M_head_impl == (EVP_PKEY *)0x0) break;
    local_e8 = EVP_PKEY_get1_tls_encodedpoint(local_160._M_head_impl,(uint8_t **)&local_e0);
    local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
    testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
              ((internal *)local_150,"len","0u",&local_e8,(uint *)local_1a8);
    if (local_150[0] == '\0') {
      testing::Message::Message((Message *)local_1a8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((_Alloc_hider *)local_150._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x4b8,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_1a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
      if (local_1a8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1a8 + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_150 + 8);
        __ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150._8_8_
        ;
        goto LAB_0028bc40;
      }
      goto LAB_0028bc45;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_150 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_150._8_8_);
    }
    local_1a8 = (undefined1  [8])local_e0;
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
    local_1c8._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          ((long)&local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start + lVar4);
    pbStack_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (*(long *)((long)&local_b8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar4) -
                  (long)local_1c8._M_head_impl);
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_150,"Bytes(data, len)","Bytes(test.encoded_point)",
               (Bytes *)local_1a8,(Bytes *)&local_1c8);
    if (local_150[0] == '\0') {
      testing::Message::Message((Message *)local_1a8);
      message = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = ((_Alloc_hider *)local_150._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x4b9,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_1a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
      if (local_1a8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1a8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_150 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_150._8_8_);
    }
    OPENSSL_free(local_e0);
    local_158._M_head_impl = (evp_pkey_st *)EVP_PKEY_new();
    local_1a8[0] = (internal)((EVP_PKEY *)local_158._M_head_impl != (EVP_PKEY *)0x0);
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((EVP_PKEY *)local_158._M_head_impl == (EVP_PKEY *)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_150,(internal *)local_1a8,(AssertionResult *)"from_encoded_point",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x4bd,(char *)local_150._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8);
LAB_0028b95f:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
      if ((anon_union_32_2_4f6aaa2e_for_u *)local_150._0_8_ != &local_140) {
        operator_delete((void *)local_150._0_8_,(ulong)(local_140.base.buf + 1));
      }
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
      if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1a0,local_1a0);
      }
      bVar6 = true;
    }
    else {
      iVar2 = *(int *)((long)local_d8 + lVar4);
      if (iVar2 != 0x198) {
        iVar2 = EVP_PKEY_set_type((EVP_PKEY *)local_158._M_head_impl,iVar2);
        local_1a8[0] = (internal)(iVar2 != 0);
        local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 != 0) goto LAB_0028b74d;
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_150,(internal *)local_1a8,
                   (AssertionResult *)"EVP_PKEY_set_type(from_encoded_point.get(), test.pkey_type)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4c4,(char *)local_150._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8)
        ;
        goto LAB_0028b95f;
      }
      iVar2 = EVP_PKEY_copy_parameters
                        ((EVP_PKEY *)local_158._M_head_impl,(EVP_PKEY *)local_160._M_head_impl);
      local_1a8[0] = (internal)(iVar2 != 0);
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_150,(internal *)local_1a8,
                   (AssertionResult *)
                   "EVP_PKEY_copy_parameters(from_encoded_point.get(), from_spki.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4c2,(char *)local_150._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8)
        ;
        goto LAB_0028b95f;
      }
LAB_0028b74d:
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      in = *(uint8_t **)
            ((long)&local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar4);
      iVar2 = EVP_PKEY_set1_tls_encodedpoint
                        (local_158._M_head_impl,in,
                         *(long *)((long)&local_b8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + lVar4) -
                         (long)in);
      local_1a8[0] = (internal)(iVar2 != 0);
      local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_1c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_150,(internal *)local_1a8,
                   (AssertionResult *)
                   "EVP_PKEY_set1_tls_encodedpoint(from_encoded_point.get(), test.encoded_point.data(), test.encoded_point.size())"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_1d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4c8,(char *)local_150._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8)
        ;
        goto LAB_0028b95f;
      }
      CBB_zero((CBB *)local_150);
      iVar2 = CBB_init((CBB *)local_150,
                       *(long *)((long)&local_d0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + lVar4) -
                       *(long *)((long)&local_d0.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar4));
      local_1c8._M_head_impl._0_1_ = iVar2 != 0;
      pbStack_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_1d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_1a8,(internal *)&local_1c8,
                   (AssertionResult *)"CBB_init(cbb.get(), test.spki.size())","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x4cb,(char *)local_1a8);
        testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_1d8);
LAB_0028ba6c:
        testing::internal::AssertHelper::~AssertHelper(&local_f0);
        if (local_1a8 != (undefined1  [8])local_198) {
          operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
        }
        if ((long *)local_1d8.span_.data_ != (long *)0x0) {
          (**(code **)(*(long *)local_1d8.span_.data_ + 8))();
        }
        if (pbStack_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_1c0,pbStack_1c0);
        }
        bVar6 = true;
      }
      else {
        iVar2 = EVP_marshal_public_key((CBB *)local_150,local_158._M_head_impl);
        local_1c8._M_head_impl._0_1_ = iVar2 != 0;
        pbStack_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_1d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_1a8,(internal *)&local_1c8,
                     (AssertionResult *)
                     "EVP_marshal_public_key(cbb.get(), from_encoded_point.get())","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_f0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x4cc,(char *)local_1a8);
          testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_1d8);
          goto LAB_0028ba6c;
        }
        pbVar3 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CBB_data((CBB *)local_150);
        pbStack_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CBB_len((CBB *)local_150);
        local_1d8.span_.data_ =
             *(uchar **)
              ((long)&local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar4);
        local_1d8.span_.size_ =
             *(long *)((long)&local_d0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish + lVar4) -
             (long)local_1d8.span_.data_;
        local_1c8._M_head_impl = pbVar3;
        testing::internal::CmpHelperEQ<Bytes,Bytes>
                  ((internal *)local_1a8,"Bytes(CBB_data(cbb.get()), CBB_len(cbb.get()))",
                   "Bytes(test.spki)",(Bytes *)&local_1c8,&local_1d8);
        if (local_1a8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_1c8);
          pcVar5 = "";
          if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_1a0->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_1d8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x4cd,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_1d8,(Message *)&local_1c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
          if (local_1c8._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
          }
        }
        if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_1a0,local_1a0);
        }
        bVar6 = false;
      }
      CBB_cleanup((CBB *)local_150);
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_158);
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_160);
    testing::ScopedTrace::~ScopedTrace(&local_1da);
    testing::ScopedTrace::~ScopedTrace(&local_1d9);
    if ((bVar6) || (bVar6 = lVar4 == 0x38, lVar4 = lVar4 + 0x38, bVar6)) goto LAB_0028bc66;
  }
  testing::Message::Message((Message *)&local_1c8);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)local_150,(internal *)local_1a8,(AssertionResult *)"from_spki","false","true"
             ,in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_1d8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
             ,0x4b4,(char *)local_150._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
  if ((anon_union_32_2_4f6aaa2e_for_u *)local_150._0_8_ != &local_140) {
    operator_delete((void *)local_150._0_8_,(ulong)(local_140.base.buf + 1));
  }
  if (local_1c8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
  }
  if (local_1a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1a0;
    __ptr = local_1a0;
LAB_0028bc40:
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr);
  }
LAB_0028bc45:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_160);
  testing::ScopedTrace::~ScopedTrace(&local_1da);
  testing::ScopedTrace::~ScopedTrace(&local_1d9);
LAB_0028bc66:
  lVar4 = 0x70;
  do {
    pvVar1 = *(void **)((long)&local_f0.data_ + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_d8 + lVar4 + -8) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)alStack_108 + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)alStack_108 + lVar4 + 0x10) - (long)pvVar1);
    }
    lVar4 = lVar4 + -0x38;
  } while (lVar4 != 0);
  return;
}

Assistant:

TEST(EVPExtraTest, TLSEncodedPoint) {
  const struct {
    int pkey_type;
    std::vector<uint8_t> spki;
    std::vector<uint8_t> encoded_point;
  } kTests[] = {
      {EVP_PKEY_EC,
       {0x30, 0x59, 0x30, 0x13, 0x06, 0x07, 0x2a, 0x86, 0x48, 0xce, 0x3d, 0x02,
        0x01, 0x06, 0x08, 0x2a, 0x86, 0x48, 0xce, 0x3d, 0x03, 0x01, 0x07, 0x03,
        0x42, 0x00, 0x04, 0x2c, 0x15, 0x0f, 0x42, 0x9c, 0xe7, 0x0f, 0x21, 0x6c,
        0x25, 0x2c, 0xf5, 0xe0, 0x62, 0xce, 0x1f, 0x63, 0x9c, 0xd5, 0xd1, 0x65,
        0xc7, 0xf8, 0x94, 0x24, 0x07, 0x2c, 0x27, 0x19, 0x7d, 0x78, 0xb3, 0x3b,
        0x92, 0x0e, 0x95, 0xcd, 0xb6, 0x64, 0xe9, 0x90, 0xdc, 0xf0, 0xcf, 0xea,
        0x0d, 0x94, 0xe2, 0xa8, 0xe6, 0xaf, 0x9d, 0x0e, 0x58, 0x05, 0x6e, 0x65,
        0x31, 0x04, 0x92, 0x5b, 0x9f, 0xe6, 0xc9},
       {0x04, 0x2c, 0x15, 0x0f, 0x42, 0x9c, 0xe7, 0x0f, 0x21, 0x6c, 0x25,
        0x2c, 0xf5, 0xe0, 0x62, 0xce, 0x1f, 0x63, 0x9c, 0xd5, 0xd1, 0x65,
        0xc7, 0xf8, 0x94, 0x24, 0x07, 0x2c, 0x27, 0x19, 0x7d, 0x78, 0xb3,
        0x3b, 0x92, 0x0e, 0x95, 0xcd, 0xb6, 0x64, 0xe9, 0x90, 0xdc, 0xf0,
        0xcf, 0xea, 0x0d, 0x94, 0xe2, 0xa8, 0xe6, 0xaf, 0x9d, 0x0e, 0x58,
        0x05, 0x6e, 0x65, 0x31, 0x04, 0x92, 0x5b, 0x9f, 0xe6, 0xc9}},
      {EVP_PKEY_X25519,
       {0x30, 0x2a, 0x30, 0x05, 0x06, 0x03, 0x2b, 0x65, 0x6e, 0x03, 0x21,
        0x00, 0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94,
        0xc1, 0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26,
        0xb3, 0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c},
       {0xe6, 0xdb, 0x68, 0x67, 0x58, 0x30, 0x30, 0xdb, 0x35, 0x94, 0xc1,
        0xa4, 0x24, 0xb1, 0x5f, 0x7c, 0x72, 0x66, 0x24, 0xec, 0x26, 0xb3,
        0x35, 0x3b, 0x10, 0xa9, 0x03, 0xa6, 0xd0, 0xab, 0x1c, 0x4c}}};
  for (const auto& test : kTests) {
    SCOPED_TRACE(test.pkey_type);
    SCOPED_TRACE(Bytes(test.spki));
    CBS spki;
    CBS_init(&spki, test.spki.data(), test.spki.size());
    bssl::UniquePtr<EVP_PKEY> from_spki(EVP_parse_public_key(&spki));
    ASSERT_TRUE(from_spki);

    uint8_t *data;
    size_t len = EVP_PKEY_get1_tls_encodedpoint(from_spki.get(), &data);
    ASSERT_GT(len, 0u);
    EXPECT_EQ(Bytes(data, len), Bytes(test.encoded_point));
    OPENSSL_free(data);

    bssl::UniquePtr<EVP_PKEY> from_encoded_point(EVP_PKEY_new());
    ASSERT_TRUE(from_encoded_point);
    if (test.pkey_type == EVP_PKEY_EC) {
      // |EVP_PKEY_EC| should have been |EVP_PKEY_EC_P256|, etc., but instead
      // part of the type is buried inside parameters.
      ASSERT_TRUE(
          EVP_PKEY_copy_parameters(from_encoded_point.get(), from_spki.get()));
    } else {
      ASSERT_TRUE(EVP_PKEY_set_type(from_encoded_point.get(), test.pkey_type));
    }
    ASSERT_TRUE(EVP_PKEY_set1_tls_encodedpoint(from_encoded_point.get(),
                                               test.encoded_point.data(),
                                               test.encoded_point.size()));

    bssl::ScopedCBB cbb;
    ASSERT_TRUE(CBB_init(cbb.get(), test.spki.size()));
    ASSERT_TRUE(EVP_marshal_public_key(cbb.get(), from_encoded_point.get()));
    EXPECT_EQ(Bytes(CBB_data(cbb.get()), CBB_len(cbb.get())), Bytes(test.spki));
  }
}